

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# externals.c
# Opt level: O0

void ucrcourse_results_destroy(course_results *results)

{
  ulong local_18;
  size_t i;
  course_results *results_local;
  
  if (results != (course_results *)0x0) {
    for (local_18 = 0; local_18 < results->length; local_18 = local_18 + 1) {
      free(results->courses[local_18].course_number);
      free(results->courses[local_18].course_name);
      free(results->courses[local_18].course_id);
      free(results->courses[local_18].instructor);
      free(results->courses[local_18].co_requisites);
      free(results->courses[local_18].pre_requisites);
    }
    free(results);
  }
  return;
}

Assistant:

void ucrcourse_results_destroy(struct course_results *results)
{
	size_t i;

	if (!results) {
		return;
	}

	for (i = 0; i < results->length; i++) {
		free((void *)results->courses[i].course_number);
		free((void *)results->courses[i].course_name);
		free((void *)results->courses[i].course_id);
		free((void *)results->courses[i].instructor);
		free((void *)results->courses[i].co_requisites);
		free((void *)results->courses[i].pre_requisites);
	}

	free(results);
}